

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

Literals * __thiscall
wasm::Precompute::precomputeValue
          (Literals *__return_storage_ptr__,Precompute *this,Expression *curr)

{
  bool bVar1;
  undefined1 local_68 [8];
  Flow flow;
  Expression *curr_local;
  Precompute *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  precomputeExpression((Flow *)local_68,this,curr,false);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Literals::Literals(__return_storage_ptr__);
  }
  else {
    Literals::Literals(__return_storage_ptr__,(Literals *)local_68);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Literals precomputeValue(Expression* curr) {
    // Note that we set replaceExpression to false, as we just care about
    // the value here.
    Flow flow = precomputeExpression(curr, false /* replaceExpression */);
    if (flow.breaking()) {
      return {};
    }
    return flow.values;
  }